

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magicBoxTest.cc
# Opt level: O0

void __thiscall example_add_Test::TestBody(example_add_Test *this)

{
  bool bVar1;
  char *message;
  double val1;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  MagicBox mb;
  double res;
  example_add_Test *this_local;
  
  val1 = MagicBox::smash((MagicBox *)((long)&gtest_ar.message_.ptr_ + 7),5.0,3);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_30,"res","15.0","1.0e-11",val1,15.0,1e-11);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jdalt[P]nan-plus-unit-tests/test_native/magicBoxTest.cc"
               ,9,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(example, add)
{
    double res;
    MagicBox mb;
    res = mb.smash(5.0, 3);
    ASSERT_NEAR(res, 15.0, 1.0e-11);
}